

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O1

void rescan_config(void)

{
  code *pcVar1;
  job_t *pjVar2;
  char *pcVar3;
  ctor_f *pcVar4;
  size_t __n;
  UT_array *jobs;
  int iVar5;
  UT_string *em;
  char *pcVar6;
  UT_array *pUVar7;
  job_t *pjVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  char **ppcVar17;
  job_t *a;
  bool bVar18;
  
  syslog(6,"rescanning job configuration");
  em = (UT_string *)calloc(0x18,1);
  if (em != (UT_string *)0x0) {
    pcVar6 = (char *)malloc(100);
    em->d = (char *)0x0;
    em->n = 0;
    em->i = 0;
    em->d = pcVar6;
    if (pcVar6 != (char *)0x0) {
      em->n = 100;
      *pcVar6 = '\0';
      jobs = cfg.jobs;
      pUVar7 = (UT_array *)malloc(0x30);
      (pUVar7->icd).dtor = (undefined1 *)0x0;
      pUVar7->d = (char *)0x0;
      (pUVar7->icd).init = (undefined1 *)0x0;
      (pUVar7->icd).copy = (ctor_f *)0x0;
      pUVar7->i = 0;
      pUVar7->n = 0;
      (pUVar7->icd).sz = 0;
      (pUVar7->icd).copy = job_cpy;
      (pUVar7->icd).dtor = job_fin;
      (pUVar7->icd).sz = 0x218;
      (pUVar7->icd).init = job_ini;
      cfg.jobs = pUVar7;
      close_sockets(&cfg);
      iVar5 = parse_jobs(&cfg,em);
      if (iVar5 == -1) {
        syslog(2,"FAILED to parse %s",cfg.file);
        syslog(2,"ERROR: %s",em->d);
        syslog(2,"NOTE: using PREVIOUS job config");
        cfg.jobs = jobs;
      }
      else {
        a = (job_t *)0x0;
LAB_00108505:
        if (a == (job_t *)0x0) {
          if ((ulong)pUVar7->i == 0) goto LAB_00108543;
          a = (job_t *)pUVar7->d;
        }
        else {
          pjVar8 = (job_t *)pUVar7->d;
          if (a < pjVar8) {
            uVar9 = 0;
          }
          else {
            uVar9 = (ulong)((long)a - (long)pjVar8) / (pUVar7->icd).sz + 1;
          }
          if (uVar9 < pUVar7->i) {
            uVar9 = (pUVar7->icd).sz;
            if (a < pjVar8) {
              lVar16 = 0;
            }
            else {
              lVar16 = (ulong)((long)a - (long)pjVar8) / uVar9 + 1;
            }
            a = (job_t *)((long)&pjVar8->name + lVar16 * uVar9);
          }
          else {
LAB_00108543:
            a = (job_t *)0x0;
          }
        }
        if (a != (job_t *)0x0) {
          pjVar8 = get_job_by_name(jobs,a->name);
          if (pjVar8 != (job_t *)0x0) {
            iVar5 = job_cmp(a,pjVar8);
            if (iVar5 == 0) {
              job_fin(a);
              job_cpy(a,pjVar8);
            }
            else {
              a->start_ts = pjVar8->start_ts;
              iVar5 = pjVar8->pid;
              a->pid = iVar5;
              if (iVar5 != 0) {
                a->terminate = 1;
              }
            }
            pcVar1 = (code *)(jobs->icd).dtor;
            if (pcVar1 != (code *)0x0) {
              pjVar2 = (job_t *)jobs->d;
              uVar9 = 0xffffffffffffffff;
              if (pjVar2 <= pjVar8) {
                uVar9 = (ulong)((long)pjVar8 - (long)pjVar2) / (jobs->icd).sz;
              }
              if (uVar9 < jobs->i) {
                uVar9 = (jobs->icd).sz;
                uVar10 = 0xffffffffffffffff;
                if (pjVar2 <= pjVar8) {
                  uVar10 = (ulong)((long)pjVar8 - (long)pjVar2) / uVar9;
                }
                ppcVar17 = (char **)((long)&pjVar2->name + uVar10 * uVar9);
              }
              else {
                ppcVar17 = (char **)0x0;
              }
              (*pcVar1)(ppcVar17);
            }
            pjVar2 = (job_t *)jobs->d;
            if (pjVar8 < pjVar2) {
              uVar9 = 0;
            }
            else {
              uVar9 = (ulong)((long)pjVar8 - (long)pjVar2) / (jobs->icd).sz + 1;
            }
            if (uVar9 < jobs->i) {
              uVar9 = (jobs->icd).sz;
              uVar10 = 0xffffffffffffffff;
              if (pjVar2 <= pjVar8) {
                uVar10 = (ulong)((long)pjVar8 - (long)pjVar2) / uVar9;
              }
              if (pjVar8 < pjVar2) {
                lVar16 = 0;
              }
              else {
                lVar16 = (ulong)((long)pjVar8 - (long)pjVar2) / uVar9 + 1;
              }
              if (pjVar8 < pjVar2) {
                uVar15 = 0;
              }
              else {
                uVar15 = ~((ulong)((long)pjVar8 - (long)pjVar2) / uVar9);
              }
              memmove((char **)((long)&pjVar2->name + uVar10 * uVar9),
                      (char **)((long)&pjVar2->name + lVar16 * uVar9),(uVar15 + jobs->i) * uVar9);
            }
            jobs->i = jobs->i - 1;
          }
          goto LAB_00108505;
        }
        pcVar6 = (char *)0x0;
LAB_001086bf:
        pcVar12 = (char *)(ulong)jobs->i;
        if (pcVar6 == (char *)0x0) {
          if (pcVar12 == (char *)0x0) goto LAB_001086fd;
          pcVar6 = jobs->d;
        }
        else {
          pcVar3 = jobs->d;
          if (pcVar6 < pcVar3) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11 = (char *)((ulong)((long)pcVar6 - (long)pcVar3) / (jobs->icd).sz + 1);
          }
          if (pcVar11 < pcVar12) {
            pcVar12 = (char *)(jobs->icd).sz;
            if (pcVar6 < pcVar3) {
              lVar16 = 0;
            }
            else {
              lVar16 = (ulong)((long)pcVar6 - (long)pcVar3) / (ulong)pcVar12 + 1;
            }
            pcVar6 = pcVar3 + lVar16 * (long)pcVar12;
          }
          else {
LAB_001086fd:
            pcVar6 = (char *)0x0;
          }
        }
        if (pcVar6 != (char *)0x0) {
          if (*(int *)(pcVar6 + 0xf0) != 0) {
            pcVar6[0x108] = '\x01';
            pcVar6[0x109] = '\0';
            pcVar6[0x10a] = '\0';
            pcVar6[0x10b] = '\0';
            pcVar6[0x10c] = '\0';
            pcVar6[0x10d] = '\0';
            pcVar6[0x10e] = '\0';
            pcVar6[0x10f] = '\0';
            pcVar6[0x174] = '\0';
            pcVar6[0x175] = '\0';
            pcVar6[0x176] = '\0';
            pcVar6[0x177] = '\0';
            pcVar6[0x178] = '\x01';
            pcVar6[0x179] = '\0';
            pcVar6[0x17a] = '\0';
            pcVar6[0x17b] = '\0';
            em->i = 0;
            *em->d = '\0';
            utstring_printf(em,pcVar12,*(undefined8 *)pcVar6);
            free(*(void **)pcVar6);
            pcVar12 = strdup(em->d);
            *(char **)pcVar6 = pcVar12;
            pUVar7 = cfg.jobs;
            uVar14 = (cfg.jobs)->i + 1;
            if ((cfg.jobs)->n < uVar14) {
              uVar13 = (cfg.jobs)->n;
              if (uVar13 < uVar14) {
                do {
                  bVar18 = uVar13 == 0;
                  uVar13 = uVar13 * 2;
                  if (bVar18) {
                    uVar13 = 8;
                  }
                } while (uVar13 < uVar14);
                (cfg.jobs)->n = uVar13;
              }
              pcVar12 = (char *)realloc(pUVar7->d,(ulong)uVar13 * (pUVar7->icd).sz);
              (cfg.jobs)->d = pcVar12;
              if (pcVar12 == (char *)0x0) goto LAB_001088ad;
            }
            pcVar4 = ((cfg.jobs)->icd).copy;
            __n = ((cfg.jobs)->icd).sz;
            uVar14 = (cfg.jobs)->i;
            ppcVar17 = &(cfg.jobs)->d;
            (cfg.jobs)->i = uVar14 + 1;
            if (pcVar4 == (ctor_f *)0x0) {
              memcpy(*ppcVar17 + uVar14 * __n,pcVar6,__n);
            }
            else {
              (*pcVar4)(*ppcVar17 + uVar14 * __n,pcVar6);
            }
          }
          goto LAB_001086bf;
        }
        if (jobs->n != 0) {
          if (((jobs->icd).dtor != (undefined1 *)0x0) && (jobs->i != 0)) {
            uVar9 = 0;
            do {
              (*(code *)(jobs->icd).dtor)(jobs->d + (jobs->icd).sz * uVar9);
              uVar9 = uVar9 + 1;
            } while (uVar9 < jobs->i);
          }
          free(jobs->d);
        }
        jobs->n = 0;
        free(jobs);
      }
      if (em->d != (char *)0x0) {
        free(em->d);
      }
      em->n = 0;
      free(em);
      return;
    }
  }
LAB_001088ad:
  exit(-1);
}

Assistant:

void rescan_config(void) {
  job_t *job, *old;
  int c;

  syslog(LOG_INFO,"rescanning job configuration");
  UT_string *em; utstring_new(em);
  UT_array *previous_jobs = cfg.jobs;
  UT_array *new_jobs; utarray_new(new_jobs, &job_mm); cfg.jobs = new_jobs;

  /* udp sockets get re-opened during config parsing */
  close_sockets(&cfg); 

  if (parse_jobs(&cfg, em) == -1) {
    syslog(LOG_CRIT,"FAILED to parse %s", cfg.file);
    syslog(LOG_CRIT,"ERROR: %s", utstring_body(em));
    syslog(LOG_CRIT,"NOTE: using PREVIOUS job config");
    cfg.jobs = previous_jobs;
    goto done;
  }

  /* parse succeeded. diff the new jobs vs. existing jobs */
  job=NULL;
  while( (job = (job_t*)utarray_next(new_jobs,job))) {
    old = get_job_by_name(previous_jobs, job->name);
    if (!old) continue;          // new job definition; startup forthcoming.
    c = job_cmp(job,old);        
    if (c == 0) {                // new job with same name and identical to old:
      job_fin(job);              // free up new job,
      job_cpy(job,old);          // and copy old job into new to retain pid etc.
    } else {                     // new job with same name, but new config:
      job->start_ts = old->start_ts;
      job->pid = old->pid;
      if (job->pid) job->terminate=1;// induce reset to pick up new settings.
    }
    utarray_erase(previous_jobs, utarray_eltidx(previous_jobs,old), 1);
  }
  /* any jobs left in previous_jobs are no longer in the new configuration */
  old=NULL;
  while ( (old=(job_t*)utarray_next(previous_jobs,old))) {
    if (old->pid == 0) continue; /* not running. free it below. */
    /* terminate old job, but keep a record of it til it exits */
    old->terminate=1;
    old->respawn=0;
    old->delete_when_collected=1;
    utstring_clear(em); utstring_printf(em, "%s(deleted)", old->name);
    free(old->name); old->name = strdup(utstring_body(em));
    utarray_push_back(cfg.jobs, old); 
  }
  utarray_free(previous_jobs);

 done:
  utstring_free(em);
}